

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_number_int(parser *this,token *t)

{
  bool bVar1;
  string *psVar2;
  long *plVar3;
  json *this_00;
  json_parser_exception *this_01;
  size_t byte_index;
  token *in_RDX;
  int local_1a4;
  istringstream local_1a0 [4];
  int i;
  istringstream is;
  token *t_local;
  parser *this_local;
  
  psVar2 = token::get_raw_value_abi_cxx11_(in_RDX);
  std::__cxx11::istringstream::istringstream(local_1a0,psVar2,8);
  plVar3 = (long *)std::istream::operator>>(local_1a0,&local_1a4);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if (bVar1) {
    this_00 = (json *)operator_new(0x58);
    json::json(this_00,local_1a4);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,this_00);
  }
  else {
    if ((t->field_0x21 & 1) == 0) {
      this_01 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      psVar2 = token::get_raw_value_abi_cxx11_(in_RDX);
      byte_index = reader::get_byte_index((reader *)t->_vptr_token);
      json_parser_exception::json_parser_exception(this_01,number_out_of_range_e,psVar2,byte_index);
      __cxa_throw(this_01,&json_parser_exception::typeinfo,
                  json_parser_exception::~json_parser_exception);
    }
    parse_number_double(this,t);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse_number_int(const token &t)
{
    istringstream is(t.get_raw_value());

    int i;

    if (is >> i)
    {
        return unique_ptr<json>(new json(i));
    }
    else
    {
        // We know the int is syntactically correct so this has to be a range error.
        if (m_fallback_to_double)
        {
            return parse_number_double(t);
        }
        else
        {
            throw json_parser_exception(
                        json_parser_exception::number_out_of_range_e,
                        t.get_raw_value(),
                        m_reader.get_byte_index());
        }
    }
}